

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# late_materialization.cpp
# Opt level: O1

void __thiscall
duckdb::LateMaterialization::ReplaceTableReferences
          (LateMaterialization *this,Expression *expr,idx_t new_table_index)

{
  BoundColumnRefExpression *pBVar1;
  idx_t local_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_40 = new_table_index;
  if ((expr->super_BaseExpression).type == BOUND_COLUMN_REF) {
    pBVar1 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&expr->super_BaseExpression);
    (pBVar1->binding).table_index = local_40;
  }
  local_38._8_8_ = &local_40;
  pcStack_20 = ::std::
               _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/late_materialization.cpp:148:40)>
               ::_M_invoke;
  local_28 = ::std::
             _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/late_materialization.cpp:148:40)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  ExpressionIterator::EnumerateChildren(expr,(function<void_(duckdb::Expression_&)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void LateMaterialization::ReplaceTableReferences(Expression &expr, idx_t new_table_index) {
	if (expr.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		auto &bound_column_ref = expr.Cast<BoundColumnRefExpression>();
		bound_column_ref.binding.table_index = new_table_index;
	}

	ExpressionIterator::EnumerateChildren(expr,
	                                      [&](Expression &child) { ReplaceTableReferences(child, new_table_index); });
}